

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O0

wchar_t compute_rubble_penalty(player *p)

{
  undefined1 uVar1;
  _Bool _Var2;
  wchar_t wVar3;
  object *obj;
  uint local_184;
  uint local_180;
  uint remainder;
  uint scl_turns;
  my_rational avg_turns;
  wchar_t penalty;
  uint uStack_168;
  _Bool swapped_digger;
  wchar_t num_digger;
  int digging_chances [5];
  player_state_conflict *used_state;
  player_state_conflict local_state;
  object *best_digger;
  object *current_weapon;
  wchar_t weapon_slot;
  player *p_local;
  
  wVar3 = slot_by_name(p,"weapon");
  obj = slot_object(p,wVar3);
  local_state.el_info._92_8_ = player_best_digger(p,false);
  penalty._0_1_ = 1;
  uVar1 = (undefined1)penalty;
  penalty._0_1_ = 1;
  if (((object *)local_state.el_info._92_8_ == obj) ||
     ((obj != (object *)0x0 && (_Var2 = obj_can_takeoff(obj), !_Var2)))) {
    avg_turns.d._3_1_ = 0;
    register0x00000000 = &p->state;
  }
  else {
    avg_turns.d._3_1_ = 1;
    penalty._0_1_ = uVar1;
    if (local_state.el_info._92_8_ != 0) {
      penalty._0_1_ = *(undefined1 *)(local_state.el_info._92_8_ + 0x11a);
      *(undefined1 *)(local_state.el_info._92_8_ + 0x11a) = 1;
    }
    (p->body).slots[wVar3].obj = (object *)local_state.el_info._92_8_;
    memcpy(&used_state,&p->state,0x120);
    calc_bonuses(p,(player_state_conflict *)&used_state,false,true);
    unique0x00004880 = (player_state_conflict *)&used_state;
  }
  calc_digging_chances(stack0xfffffffffffffeb0,(int *)&stack0xfffffffffffffe98);
  if ((avg_turns.d._3_1_ & 1) != 0) {
    if (local_state.el_info._92_8_ != 0) {
      *(undefined1 *)(local_state.el_info._92_8_ + 0x11a) = (undefined1)penalty;
    }
    (p->body).slots[wVar3].obj = obj;
    calc_bonuses(p,(player_state_conflict *)&used_state,false,true);
  }
  if ((int)uStack_168 < 1) {
    avg_turns.n = 0x7fffffff;
  }
  else if ((int)uStack_168 < 0x640) {
    _remainder = my_rational_construct(0x640,uStack_168);
    local_180 = my_rational_to_uint((my_rational *)&remainder,0x10,&local_184);
    if (local_180 < 0x7fffffff) {
      avg_turns.n = local_180;
      if (scl_turns + 1 >> 1 <= local_184) {
        avg_turns.n = local_180 + 1;
      }
    }
    else {
      avg_turns.n = 0x7fffffff;
    }
  }
  else {
    avg_turns.n = 0x10;
  }
  wVar3 = convert_turn_penalty(avg_turns.n,p);
  return wVar3;
}

Assistant:

static int compute_rubble_penalty(struct player *p)
{
	int weapon_slot = slot_by_name(p, "weapon");
	struct object *current_weapon = slot_object(p, weapon_slot);
	struct object *best_digger = player_best_digger(p, false);
	struct player_state local_state, *used_state;
	int digging_chances[DIGGING_MAX], num_digger = 1;
	bool swapped_digger;
	int penalty;

	if (best_digger != current_weapon && (!current_weapon
			|| obj_can_takeoff(current_weapon))) {
		swapped_digger = true;
		if (best_digger) {
			num_digger = best_digger->number;
			best_digger->number = 1;
		}
		p->body.slots[weapon_slot].obj = best_digger;
		memcpy(&local_state, &p->state, sizeof(local_state));
		calc_bonuses(p, &local_state, false, true);
		used_state = &local_state;
	} else {
		swapped_digger = false;
		used_state = &p->state;
	}
	calc_digging_chances(used_state, digging_chances);
	if (swapped_digger) {
		if (best_digger) {
			best_digger->number = num_digger;
		}
		p->body.slots[weapon_slot].obj = current_weapon;
		calc_bonuses(p, &local_state, false, true);
	}
	if (digging_chances[DIGGING_RUBBLE] <= 0) {
		/* Can not dig through rubble at all. */
		penalty = INT_MAX;
	} else if (digging_chances[DIGGING_RUBBLE] >= 1600) {
		/* Takes one turn to dig through rubble. */
		penalty = PF_SCL;
	} else {
		/*
		 * On average, it takes 1600 / digging_chances[DIGGING_RUBBLE]
		 * turns to dig through rubble.  Round the result to the nearest
		 * integer after scaling by PF_SCL.
		 */
		struct my_rational avg_turns = my_rational_construct(1600,
			digging_chances[DIGGING_RUBBLE]);
		unsigned int scl_turns, remainder;

		scl_turns = my_rational_to_uint(&avg_turns, PF_SCL,
			&remainder);
		if (scl_turns < INT_MAX) {
			penalty = (int)scl_turns;
			if (remainder >= (avg_turns.d + 1) / 2) {
				++penalty;
			}
		} else {
			penalty = INT_MAX;
		}
	}

	return convert_turn_penalty(penalty, p);
}